

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall Assimp::IFC::TempOpening::Transform(TempOpening *this,IfcMatrix4 *mat)

{
  bool bVar1;
  element_type *peVar2;
  aiMatrix3x3t<double> local_60;
  IfcMatrix4 *local_18;
  IfcMatrix4 *mat_local;
  TempOpening *this_local;
  
  local_18 = mat;
  mat_local = (IfcMatrix4 *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->profileMesh);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->profileMesh);
    TempMesh::Transform(peVar2,local_18);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->profileMesh2D);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->profileMesh2D);
    TempMesh::Transform(peVar2,local_18);
  }
  aiMatrix3x3t<double>::aiMatrix3x3t(&local_60,local_18);
  aiVector3t<double>::operator*=(&this->extrusionDir,&local_60);
  return;
}

Assistant:

void TempOpening::Transform(const IfcMatrix4& mat) {
    if(profileMesh) {
        profileMesh->Transform(mat);
    }
    if(profileMesh2D) {
        profileMesh2D->Transform(mat);
    }
    extrusionDir *= IfcMatrix3(mat);
}